

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

void despot::AEMS::Update(VNode *vnode)

{
  bool bVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  QNode *this;
  ACT_TYPE action;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double local_28;
  double local_20;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (!bVar1) {
    uVar3 = 0;
    local_20 = -INFINITY;
    local_28 = -INFINITY;
    while( true ) {
      pvVar2 = VNode::children(vnode);
      if ((ulong)((long)(pvVar2->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar2->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
      this = VNode::Child(vnode,(ACT_TYPE)uVar3);
      dVar4 = QNode::lower_bound(this);
      if (dVar4 <= local_28) {
        dVar4 = local_28;
      }
      dVar5 = QNode::upper_bound(this);
      if (dVar5 <= local_20) {
        dVar5 = local_20;
      }
      uVar3 = uVar3 + 1;
      local_28 = dVar4;
      local_20 = dVar5;
    }
    dVar4 = VNode::lower_bound(vnode);
    if (dVar4 < local_28) {
      VNode::lower_bound(vnode,local_28);
    }
    dVar4 = VNode::upper_bound(vnode);
    if (local_20 < dVar4) {
      VNode::upper_bound(vnode,local_20);
      return;
    }
  }
  return;
}

Assistant:

void AEMS::Update(VNode* vnode) {
	if (vnode->IsLeaf())
		return;

	double lower = Globals::NEG_INFTY;
	double upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
	}

	if (lower > vnode->lower_bound())
		vnode->lower_bound(lower);
	if (upper < vnode->upper_bound())
		vnode->upper_bound(upper);
}